

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool print_value(cJSON *item,printbuffer *output_buffer)

{
  double dVar1;
  char cVar2;
  cJSON_bool cVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  uchar *puVar7;
  size_t i;
  ulong uVar8;
  ulong uVar9;
  size_t needed;
  long lVar10;
  cJSON *item_00;
  cJSON *pcVar11;
  size_t needed_00;
  double local_50;
  uchar number_buffer [26];
  
  cVar3 = 0;
  if (output_buffer == (printbuffer *)0x0 || item == (cJSON *)0x0) {
    return 0;
  }
  cVar2 = (char)item->type;
  switch(cVar2) {
  case '\x01':
    puVar7 = ensure(output_buffer,6);
    if (puVar7 == (uchar *)0x0) {
      return 0;
    }
    builtin_memcpy(puVar7,"false",6);
    break;
  case '\x02':
    puVar7 = ensure(output_buffer,5);
    if (puVar7 == (uchar *)0x0) {
      return 0;
    }
    builtin_memcpy(puVar7,"true",5);
    break;
  case '\x03':
  case '\x05':
  case '\x06':
  case '\a':
    goto switchD_00106f2c_caseD_3;
  case '\x04':
    puVar7 = ensure(output_buffer,5);
    if (puVar7 == (uchar *)0x0) {
      return 0;
    }
    builtin_memcpy(puVar7,"null",5);
    break;
  case '\b':
    dVar1 = item->valuedouble;
    if ((dVar1 * 0.0 != 0.0) || (NAN(dVar1 * 0.0))) {
      builtin_memcpy(number_buffer,"null",5);
      uVar8 = 4;
    }
    else {
      uVar4 = sprintf((char *)number_buffer,"%1.15g");
      iVar5 = __isoc99_sscanf(number_buffer,"%lg",&local_50);
      if (iVar5 == 1) {
        if ((local_50 != dVar1) || (NAN(local_50) || NAN(dVar1))) goto LAB_0010721c;
      }
      else {
LAB_0010721c:
        uVar4 = sprintf((char *)number_buffer,"%1.17g");
      }
      uVar8 = (ulong)uVar4;
      if (0x19 < uVar4) {
        return 0;
      }
    }
    puVar7 = ensure(output_buffer,uVar8 + 1);
    if (puVar7 == (uchar *)0x0) {
      return 0;
    }
    for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      puVar7[uVar9] = number_buffer[uVar9];
    }
    puVar7[uVar8] = '\0';
    output_buffer->offset = output_buffer->offset + uVar8;
    break;
  default:
    if (cVar2 == '\x10') {
      cVar3 = print_string_ptr((uchar *)item->valuestring,output_buffer);
      return cVar3;
    }
    if (cVar2 == ' ') {
      pcVar11 = item->child;
      puVar7 = ensure(output_buffer,1);
      if (puVar7 == (uchar *)0x0) {
        return 0;
      }
      *puVar7 = '[';
      output_buffer->offset = output_buffer->offset + 1;
      output_buffer->depth = output_buffer->depth + 1;
      while (item_00 = pcVar11, item_00 != (cJSON *)0x0) {
        cVar3 = print_value(item_00,output_buffer);
        if (cVar3 == 0) {
          return 0;
        }
        update_offset(output_buffer);
        pcVar11 = (cJSON *)0x0;
        if (item_00->next != (cJSON *)0x0) {
          uVar8 = (ulong)(output_buffer->format == 0);
          puVar7 = ensure(output_buffer,uVar8 ^ 3);
          if (puVar7 == (uchar *)0x0) {
            return 0;
          }
          *puVar7 = ',';
          if (output_buffer->format == 0) {
            puVar7 = puVar7 + 1;
          }
          else {
            puVar7[1] = ' ';
            puVar7 = puVar7 + 2;
          }
          *puVar7 = '\0';
          output_buffer->offset = output_buffer->offset + (2 - uVar8);
          pcVar11 = item_00->next;
        }
      }
      puVar7 = ensure(output_buffer,2);
      if (puVar7 == (uchar *)0x0) {
        return 0;
      }
      puVar7[0] = ']';
      puVar7[1] = '\0';
    }
    else {
      if (cVar2 != '@') {
        if (cVar2 != -0x80) {
          return 0;
        }
        if (item->valuestring == (char *)0x0) {
          return 0;
        }
        sVar6 = strlen(item->valuestring);
        puVar7 = ensure(output_buffer,sVar6 + 1);
        if (puVar7 == (uchar *)0x0) {
          return 0;
        }
        memcpy(puVar7,item->valuestring,sVar6 + 1);
        break;
      }
      pcVar11 = item->child;
      uVar8 = (ulong)(output_buffer->format == 0);
      puVar7 = ensure(output_buffer,uVar8 ^ 3);
      if (puVar7 == (uchar *)0x0) {
        return 0;
      }
      needed_00 = 2;
      *puVar7 = '{';
      output_buffer->depth = output_buffer->depth + 1;
      if (output_buffer->format != 0) {
        puVar7[1] = '\n';
      }
      output_buffer->offset = output_buffer->offset + (2 - uVar8);
      for (; pcVar11 != (cJSON *)0x0; pcVar11 = pcVar11->next) {
        if (output_buffer->format != 0) {
          puVar7 = ensure(output_buffer,output_buffer->depth);
          if (puVar7 == (uchar *)0x0) {
            return 0;
          }
          for (uVar8 = 0; uVar8 < output_buffer->depth; uVar8 = uVar8 + 1) {
            puVar7[uVar8] = '\t';
          }
          output_buffer->offset = output_buffer->offset + output_buffer->depth;
        }
        cVar3 = print_string_ptr((uchar *)pcVar11->string,output_buffer);
        if (cVar3 == 0) {
          return 0;
        }
        update_offset(output_buffer);
        needed = 2 - (ulong)(output_buffer->format == 0);
        puVar7 = ensure(output_buffer,needed);
        if (puVar7 == (uchar *)0x0) {
          return 0;
        }
        *puVar7 = ':';
        if (output_buffer->format != 0) {
          puVar7[1] = '\t';
        }
        output_buffer->offset = output_buffer->offset + needed;
        cVar3 = print_value(pcVar11,output_buffer);
        if (cVar3 == 0) {
          return 0;
        }
        update_offset(output_buffer);
        lVar10 = ((ulong)(pcVar11->next != (cJSON *)0x0) + 1) - (ulong)(output_buffer->format == 0);
        puVar7 = ensure(output_buffer,lVar10 + 1);
        if (puVar7 == (uchar *)0x0) {
          return 0;
        }
        if (pcVar11->next != (cJSON *)0x0) {
          *puVar7 = ',';
          puVar7 = puVar7 + 1;
        }
        if (output_buffer->format != 0) {
          *puVar7 = '\n';
          puVar7 = puVar7 + 1;
        }
        *puVar7 = '\0';
        output_buffer->offset = output_buffer->offset + lVar10;
      }
      if (output_buffer->format != 0) {
        needed_00 = output_buffer->depth + 1;
      }
      puVar7 = ensure(output_buffer,needed_00);
      if (puVar7 == (uchar *)0x0) {
        return 0;
      }
      if (output_buffer->format != 0) {
        for (uVar8 = 0; uVar8 < output_buffer->depth - 1; uVar8 = uVar8 + 1) {
          puVar7[uVar8] = '\t';
        }
        puVar7 = puVar7 + uVar8;
      }
      puVar7[0] = '}';
      puVar7[1] = '\0';
    }
    output_buffer->depth = output_buffer->depth - 1;
  }
  cVar3 = 1;
switchD_00106f2c_caseD_3:
  return cVar3;
}

Assistant:

static cJSON_bool print_value(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output = NULL;

    if ((item == NULL) || (output_buffer == NULL))
    {
        return false;
    }

    switch ((item->type) & 0xFF)
    {
        case cJSON_NULL:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "null");
            return true;

        case cJSON_False:
            output = ensure(output_buffer, 6);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "false");
            return true;

        case cJSON_True:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "true");
            return true;

        case cJSON_Number:
            return print_number(item, output_buffer);

        case cJSON_Raw:
        {
            size_t raw_length = 0;
            if (item->valuestring == NULL)
            {
                return false;
            }

            raw_length = strlen(item->valuestring) + sizeof("");
            output = ensure(output_buffer, raw_length);
            if (output == NULL)
            {
                return false;
            }
            memcpy(output, item->valuestring, raw_length);
            return true;
        }

        case cJSON_String:
            return print_string(item, output_buffer);

        case cJSON_Array:
            return print_array(item, output_buffer);

        case cJSON_Object:
            return print_object(item, output_buffer);

        default:
            return false;
    }
}